

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O1

void duckdb::RepeatFunction(ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  FunctionData *pFVar1;
  GlobalTableFunctionState *pGVar2;
  reference this;
  idx_t iVar3;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar2 = (data_p->global_state).ptr;
  iVar3 = (long)pFVar1[0xc]._vptr_FunctionData - (long)pGVar2[1]._vptr_GlobalTableFunctionState;
  if (0x7ff < iVar3) {
    iVar3 = 0x800;
  }
  this = vector<duckdb::Vector,_true>::operator[](&output->data,0);
  Vector::Reference(this,(Value *)(pFVar1 + 4));
  output->count = iVar3;
  pGVar2 = pGVar2 + 1;
  pGVar2->_vptr_GlobalTableFunctionState =
       (_func_int **)((long)pGVar2->_vptr_GlobalTableFunctionState + iVar3);
  return;
}

Assistant:

static void RepeatFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<RepeatFunctionData>();
	auto &state = data_p.global_state->Cast<RepeatOperatorData>();

	idx_t remaining = MinValue<idx_t>(bind_data.target_count - state.current_count, STANDARD_VECTOR_SIZE);
	output.data[0].Reference(bind_data.value);
	output.SetCardinality(remaining);
	state.current_count += remaining;
}